

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int detect_form(archive_read *a,int *is_form_d)

{
  int iVar1;
  bool bVar2;
  int local_60;
  int keywords;
  int last_is_path;
  int form_D;
  int multiline;
  int entry_cnt;
  ssize_t nl;
  ssize_t len;
  ssize_t detected_bytes;
  ssize_t ravail;
  ssize_t avail;
  char *p;
  int *is_form_d_local;
  archive_read *a_local;
  
  len = 0;
  form_D = 0;
  last_is_path = 0;
  keywords = 0;
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  p = (char *)is_form_d;
  is_form_d_local = (int *)a;
  avail = (ssize_t)__archive_read_ahead(a,1,&ravail);
  if ((void *)avail == (void *)0x0) {
    return -1;
  }
  detected_bytes = ravail;
  while ((nl = next_line((archive_read *)is_form_d_local,(char **)&avail,&ravail,&detected_bytes,
                         (ssize_t *)&multiline), 0 < nl && (_multiline != 0))) {
    if (last_is_path == 0) {
      while( true ) {
        bVar2 = false;
        if ((0 < nl) && (bVar2 = true, *(char *)avail != ' ')) {
          bVar2 = *(char *)avail == '\t';
        }
        if (!bVar2) break;
        avail = avail + 1;
        ravail = ravail + -1;
        nl = nl + -1;
      }
      if (((*(char *)avail == '#') || (*(char *)avail == '\n')) || (*(char *)avail == '\r')) {
        avail = nl + avail;
        ravail = ravail - nl;
      }
      else {
        if (*(char *)avail == '/') {
          if ((nl < 5) || (iVar1 = strncmp((char *)avail,"/set",4), iVar1 != 0)) {
            if ((nl < 7) ||
               ((iVar1 = strncmp((char *)avail,"/unset",6), iVar1 != 0 ||
                (iVar1 = bid_keyword_list((char *)(avail + 6),nl + -6,1,0), iVar1 < 1)))) break;
            if (*(char *)(avail + (nl - _multiline) + -1) == '\\') {
              last_is_path = 2;
            }
          }
          else {
            iVar1 = bid_keyword_list((char *)(avail + 4),nl + -4,0,0);
            if (iVar1 < 1) break;
            if (*(char *)(avail + (nl - _multiline) + -1) == '\\') {
              last_is_path = 2;
            }
          }
        }
        else {
          iVar1 = bid_entry((char *)avail,nl,_multiline,&local_60);
          if (iVar1 < 0) break;
          len = nl + len;
          if (keywords == 0) {
            if (local_60 == 0) {
              if (0 < iVar1) {
                keywords = -1;
              }
            }
            else {
              keywords = 1;
            }
          }
          else if (((keywords == 1) && (local_60 == 0)) && (0 < iVar1)) break;
          if ((local_60 == 0) && (*(char *)(avail + (nl - _multiline) + -1) == '\\')) {
            last_is_path = 1;
          }
          else {
            form_D = form_D + 1;
            if (2 < form_D) break;
          }
        }
        avail = nl + avail;
        ravail = ravail - nl;
      }
    }
    else {
      iVar1 = bid_keyword_list((char *)avail,nl,0,0);
      if (iVar1 < 1) break;
      if (last_is_path == 1) {
        len = nl + len;
      }
      if (*(char *)(avail + (nl - _multiline) + -1) != '\\') {
        if ((last_is_path == 1) && (form_D = form_D + 1, 2 < form_D)) break;
        last_is_path = 0;
      }
      avail = nl + avail;
      ravail = ravail - nl;
    }
  }
  if ((form_D < 3) && ((form_D < 1 || (nl != 0)))) {
    return 0;
  }
  if ((p != (char *)0x0) && (keywords == 1)) {
    p[0] = '\x01';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
  }
  return 0x20;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}